

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

bool libcellml::traverseComponentTreeForUnlinkedUnits(ComponentPtr *component)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  ComponentPtr c;
  ComponentEntity CStack_38;
  
  bVar1 = areComponentVariableUnitsUnlinked(component);
  uVar3 = 0;
  while( true ) {
    sVar2 = ComponentEntity::componentCount
                      (&((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ComponentEntity);
    if ((bVar1 != false) || (sVar2 <= uVar3)) break;
    ComponentEntity::component
              (&CStack_38,
               (size_t)(component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    bVar1 = traverseComponentTreeForUnlinkedUnits((ComponentPtr *)&CStack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &CStack_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    uVar3 = uVar3 + 1;
  }
  return bVar1;
}

Assistant:

bool traverseComponentTreeForUnlinkedUnits(const ComponentPtr &component)
{
    bool unlinkedUnits = areComponentVariableUnitsUnlinked(component);
    for (size_t index = 0; index < component->componentCount() && !unlinkedUnits; ++index) {
        auto c = component->component(index);
        unlinkedUnits = traverseComponentTreeForUnlinkedUnits(c);
    }
    return unlinkedUnits;
}